

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlParseElement(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_38;
  undefined *local_30;
  PyObject *pyobj_ctxt;
  xmlParserCtxtPtr ctxt;
  PyObject *args_local;
  PyObject *self_local;
  
  ctxt = (xmlParserCtxtPtr)args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlParseElement");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT(ctxt,"O:xmlParseElement",&local_30);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      if (local_30 == &_Py_NoneStruct) {
        local_38 = (PyObject *)0x0;
      }
      else {
        local_38 = *(PyObject **)(local_30 + 0x10);
      }
      pyobj_ctxt = local_38;
      xmlParseElement(local_38);
      _Py_INCREF((PyObject *)&_Py_NoneStruct);
      self_local = (PyObject *)&_Py_NoneStruct;
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlParseElement(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    xmlParserCtxtPtr ctxt;
    PyObject *pyobj_ctxt;

    if (libxml_deprecationWarning("xmlParseElement") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"O:xmlParseElement", &pyobj_ctxt))
        return(NULL);
    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);

    xmlParseElement(ctxt);
    Py_INCREF(Py_None);
    return(Py_None);
}